

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O3

void double_suite::test_scatter(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = '?';
  local_40 = 1.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xd7,0x1052f2,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '@';
  local_40 = 2.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xd9,0x1052f2,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = -0x7d;
  local_38[1] = '-';
  local_38[2] = -0x28;
  local_38[3] = -0x7e;
  local_38[4] = '-';
  local_38[5] = -0x28;
  local_38[6] = -6;
  local_38[7] = '?';
  local_40 = 1.67778;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.67778","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xdb,0x1052f2,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = 'E';
  local_38[1] = 'D';
  local_38[2] = 'D';
  local_38[3] = 'D';
  local_38[4] = 'D';
  local_38[5] = -0x7c;
  local_38[6] = '\b';
  local_38[7] = '@';
  local_40 = 3.06458;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3.06458","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xdd,0x1052f2,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = '\x05';
  local_38[1] = -0x38;
  local_38[2] = -0x43;
  local_38[3] = -0x1a;
  local_38[4] = 'B';
  local_38[5] = -0x2e;
  local_38[6] = '\a';
  local_38[7] = '@';
  local_40 = 2.97767;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.97767","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xdf,0x1052f2,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = 'j';
  local_38[1] = -0x1e;
  local_38[2] = 'Y';
  local_38[3] = -0x2f;
  local_38[4] = 'H';
  local_38[5] = '@';
  local_38[6] = '\x04';
  local_38[7] = '@';
  local_40 = 2.53139;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.53139","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xe1,0x1052f2,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  builtin_strncpy(local_38,"\'~WȌA\n@",8);
  local_40 = 3.28201;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3.28201","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xe3,0x1052f2,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  return;
}

Assistant:

void test_scatter()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 2.0, tolerance);
    filter.push(1.3);
    TRIAL_TEST_WITH(filter.value(), 1.67778, tolerance);
    filter.push(3.75);
    TRIAL_TEST_WITH(filter.value(), 3.06458, tolerance);
    filter.push(2.25);
    TRIAL_TEST_WITH(filter.value(), 2.97767, tolerance);
    filter.push(1.4);
    TRIAL_TEST_WITH(filter.value(), 2.53139, tolerance);
    filter.push(4.1);
    TRIAL_TEST_WITH(filter.value(), 3.28201, tolerance);
}